

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

int32_t icu_63::gregoYearFromIslamicStart(int32_t year)

{
  int local_18;
  int shift;
  int offset;
  int cycle;
  int32_t year_local;
  
  if (year < 0x575) {
    local_18 = ((year + -0x574) / 0x43 + -1) * 2 + (uint)(-(year + -0x574) % 0x43 < 0x22);
  }
  else {
    local_18 = ((year + -0x575) / 0x43) * 2 + (uint)(0x20 < (year + -0x575) % 0x43);
  }
  return (year + 0x243) - local_18;
}

Assistant:

static int32_t gregoYearFromIslamicStart(int32_t year) {
    // ad hoc conversion, improve under #10752
    // rough est for now, ok for grego 1846-2138,
    // otherwise occasionally wrong (for 3% of years)
    int cycle, offset, shift = 0;
    if (year >= 1397) {
        cycle = (year - 1397) / 67;
        offset = (year - 1397) % 67;
        shift = 2*cycle + ((offset >= 33)? 1: 0);
    } else {
        cycle = (year - 1396) / 67 - 1;
        offset = -(year - 1396) % 67;
        shift = 2*cycle + ((offset <= 33)? 1: 0);
    }
    return year + 579 - shift;
}